

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O0

string * ZXing::ToHex_abi_cxx11_(ByteArray *bytes)

{
  size_type sVar1;
  size_type sVar2;
  char *__s;
  byte *pbVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  string *in_RDI;
  size_t i;
  string res;
  allocator<char> *in_stack_ffffffffffffff88;
  string *__n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  size_type local_50;
  allocator<char> local_31;
  string local_30 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  __n = in_RDI;
  local_10 = in_RSI;
  sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(sVar1 * 3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(size_type)__n,(char)((ulong)in_RDI >> 0x38),in_stack_ffffffffffffff88);
  std::allocator<char>::~allocator(&local_31);
  local_50 = 0;
  while( true ) {
    sVar1 = local_50;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_10);
    if (sVar2 <= sVar1) break;
    __s = (char *)std::__cxx11::string::operator[]((ulong)local_30);
    pbVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,local_50);
    snprintf(__s,4,"%02X ",(ulong)*pbVar3);
    local_50 = local_50 + 1;
  }
  std::__cxx11::string::size();
  std::__cxx11::string::substr((ulong)in_RDI,(ulong)local_30);
  std::__cxx11::string::~string(local_30);
  return __n;
}

Assistant:

inline std::string ToHex(const ByteArray& bytes)
{
	std::string res(bytes.size() * 3, ' ');

	for (size_t i = 0; i < bytes.size(); ++i)
	{
#ifdef _MSC_VER
		sprintf_s(&res[i * 3], 4, "%02X ", bytes[i]);
#else
		snprintf(&res[i * 3], 4, "%02X ", bytes[i]);
#endif
	}

	return res.substr(0, res.size()-1);
}